

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::HardSwish_x86_fma::forward_inplace(HardSwish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [32];
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  long lVar12;
  long lVar13;
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  float fVar18;
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  
  iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  auVar15._8_4_ = 0x3f800000;
  auVar15._0_8_ = 0x3f8000003f800000;
  auVar15._12_4_ = 0x3f800000;
  auVar15._16_4_ = 0x3f800000;
  auVar15._20_4_ = 0x3f800000;
  auVar15._24_4_ = 0x3f800000;
  auVar15._28_4_ = 0x3f800000;
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  do {
    if (uVar10 == uVar9) {
      return 0;
    }
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar11 = (undefined1 (*) [32])(sVar5 * uVar10 * sVar4 + (long)pvVar3);
    lVar12 = 0;
    for (iVar14 = 0; iVar14 + 7 < iVar8; iVar14 = iVar14 + 8) {
      auVar2 = *pauVar11;
      fVar1 = (this->super_HardSwish).beta;
      auVar20._4_4_ = fVar1;
      auVar20._0_4_ = fVar1;
      auVar20._8_4_ = fVar1;
      auVar20._12_4_ = fVar1;
      auVar20._16_4_ = fVar1;
      auVar20._20_4_ = fVar1;
      auVar20._24_4_ = fVar1;
      auVar20._28_4_ = fVar1;
      fVar1 = (this->super_HardSwish).alpha;
      auVar22._4_4_ = fVar1;
      auVar22._0_4_ = fVar1;
      auVar22._8_4_ = fVar1;
      auVar22._12_4_ = fVar1;
      auVar22._16_4_ = fVar1;
      auVar22._20_4_ = fVar1;
      auVar22._24_4_ = fVar1;
      auVar22._28_4_ = fVar1;
      auVar6 = vfmadd213ps_fma(auVar22,auVar2,auVar20);
      auVar20 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(ZEXT816(0) << 0x40));
      auVar20 = vminps_avx(auVar20,auVar15);
      auVar7._4_4_ = auVar20._4_4_ * auVar2._4_4_;
      auVar7._0_4_ = auVar20._0_4_ * auVar2._0_4_;
      auVar7._8_4_ = auVar20._8_4_ * auVar2._8_4_;
      auVar7._12_4_ = auVar20._12_4_ * auVar2._12_4_;
      auVar7._16_4_ = auVar20._16_4_ * auVar2._16_4_;
      auVar7._20_4_ = auVar20._20_4_ * auVar2._20_4_;
      auVar7._24_4_ = auVar20._24_4_ * auVar2._24_4_;
      auVar7._28_4_ = auVar2._28_4_;
      *pauVar11 = auVar7;
      pauVar11 = pauVar11 + 1;
      lVar12 = lVar12 + 8;
    }
    for (; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
      auVar6 = *(undefined1 (*) [16])*pauVar11;
      fVar1 = (this->super_HardSwish).beta;
      auVar19._4_4_ = fVar1;
      auVar19._0_4_ = fVar1;
      auVar19._8_4_ = fVar1;
      auVar19._12_4_ = fVar1;
      fVar1 = (this->super_HardSwish).alpha;
      auVar21._4_4_ = fVar1;
      auVar21._0_4_ = fVar1;
      auVar21._8_4_ = fVar1;
      auVar21._12_4_ = fVar1;
      auVar19 = vfmadd213ps_fma(auVar21,auVar6,auVar19);
      auVar19 = vmaxps_avx(auVar19,ZEXT816(0) << 0x40);
      auVar19 = vminps_avx(auVar19,auVar16);
      auVar17._0_4_ = auVar19._0_4_ * auVar6._0_4_;
      auVar17._4_4_ = auVar19._4_4_ * auVar6._4_4_;
      auVar17._8_4_ = auVar19._8_4_ * auVar6._8_4_;
      auVar17._12_4_ = auVar19._12_4_ * auVar6._12_4_;
      *(undefined1 (*) [16])*pauVar11 = auVar17;
      pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
      lVar12 = lVar12 + 4;
    }
    lVar13 = sVar5 * sVar4 * uVar10;
    for (; (int)lVar12 < iVar8; lVar12 = lVar12 + 1) {
      fVar1 = *(float *)((long)pvVar3 + lVar12 * 4 + lVar13);
      fVar18 = 0.0;
      if (fVar1 < (this->super_HardSwish).lower) {
LAB_00423f0c:
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar13) = fVar18;
      }
      else if (fVar1 <= (this->super_HardSwish).upper) {
        auVar6 = vfmadd213ss_fma(ZEXT416((uint)(this->super_HardSwish).alpha),ZEXT416((uint)fVar1),
                                 ZEXT416((uint)(this->super_HardSwish).beta));
        fVar18 = auVar6._0_4_ * fVar1;
        goto LAB_00423f0c;
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

int HardSwish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}